

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CulturalFeatureAppearance.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::CulturalFeatureAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,CulturalFeatureAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  CulturalFeatureAppearance *local_18;
  CulturalFeatureAppearance *this_local;
  
  local_18 = this;
  this_local = (CulturalFeatureAppearance *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Cultural Feature Appearance:");
  poVar1 = std::operator<<(poVar1,"\n\tDamage:                 ");
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tSmoke Emanating:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 5 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tFlaming Effect:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xf & 1);
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Status:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x15 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tInternal Heat:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x16 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tState:                  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x17 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tExterior Lights:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1d & 1);
  poVar1 = std::operator<<(poVar1,"\n\tInterior Lights:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1d & 1);
  poVar1 = std::operator<<(poVar1,"\n\tMasked/Cloaked:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1f);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString CulturalFeatureAppearance::GetAsString() const
{
  KStringStream ss;

  ss << "Cultural Feature Appearance:"
     << "\n\tDamage:                 " << GetEnumAsStringEntityDamage( m_Damage )
     << "\n\tSmoke Emanating:        " << m_Smoke
     << "\n\tFlaming Effect:         " << m_FlamingEffectField
     << "\n\tFrozen Status:          " << m_FrozenStatus
     << "\n\tInternal Heat:          " << m_InternalHeatStatus
     << "\n\tState:                  " << m_State
     << "\n\tExterior Lights:        " << m_InteriorLights
     << "\n\tInterior Lights:        " << m_InteriorLights
     << "\n\tMasked/Cloaked:         " << m_MaskedCloaked
     << "\n";

  return ss.str();
}